

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basics_gen.c
# Opt level: O0

void greetable_skeleton_set_property(GObject *object,guint prop_id,GValue *value,GParamSpec *pspec)

{
  _ExtendedGDBusPropertyInfo *info_00;
  gboolean gVar1;
  GType GVar2;
  GreetableSkeleton *skeleton_00;
  undefined8 uVar3;
  long lVar4;
  GreetableSkeleton *skeleton;
  _ExtendedGDBusPropertyInfo *info;
  GParamSpec *pspec_local;
  GValue *value_local;
  guint prop_id_local;
  GObject *object_local;
  
  GVar2 = greetable_skeleton_get_type();
  skeleton_00 = (GreetableSkeleton *)g_type_check_instance_cast(object,GVar2);
  if ((prop_id == 0) || (prop_id != 1)) {
    g_assertion_message_expr
              (0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dpfrey[P]D-Bus_Example/build_O0/basics_gen.c"
               ,0x580,"greetable_skeleton_set_property","prop_id != 0 && prop_id - 1 < 1");
  }
  info_00 = (_ExtendedGDBusPropertyInfo *)_greetable_property_info_pointers[prop_id - 1];
  g_mutex_lock(&skeleton_00->priv->lock);
  g_object_freeze_notify(object);
  gVar1 = _g_value_equal(value,skeleton_00->priv->properties + (prop_id - 1));
  if (gVar1 == 0) {
    uVar3 = g_dbus_interface_skeleton_get_type();
    uVar3 = g_type_check_instance_cast(skeleton_00,uVar3);
    lVar4 = g_dbus_interface_skeleton_get_connection(uVar3);
    if ((lVar4 != 0) && (((byte)info_00->field_0x30 >> 1 & 1) != 0)) {
      _greetable_schedule_emit_changed
                (skeleton_00,info_00,prop_id,skeleton_00->priv->properties + (prop_id - 1));
    }
    g_value_copy(value,skeleton_00->priv->properties + (prop_id - 1));
    g_object_notify_by_pspec(object,pspec);
  }
  g_mutex_unlock(&skeleton_00->priv->lock);
  g_object_thaw_notify(object);
  return;
}

Assistant:

static void
greetable_skeleton_set_property (GObject      *object,
  guint         prop_id,
  const GValue *value,
  GParamSpec   *pspec)
{
  const _ExtendedGDBusPropertyInfo *info;
  GreetableSkeleton *skeleton = GREETABLE_SKELETON (object);
  g_assert (prop_id != 0 && prop_id - 1 < 1);
  info = (const _ExtendedGDBusPropertyInfo *) _greetable_property_info_pointers[prop_id - 1];
  g_mutex_lock (&skeleton->priv->lock);
  g_object_freeze_notify (object);
  if (!_g_value_equal (value, &skeleton->priv->properties[prop_id - 1]))
    {
      if (g_dbus_interface_skeleton_get_connection (G_DBUS_INTERFACE_SKELETON (skeleton)) != NULL &&
          info->emits_changed_signal)
        _greetable_schedule_emit_changed (skeleton, info, prop_id, &skeleton->priv->properties[prop_id - 1]);
      g_value_copy (value, &skeleton->priv->properties[prop_id - 1]);
      g_object_notify_by_pspec (object, pspec);
    }
  g_mutex_unlock (&skeleton->priv->lock);
  g_object_thaw_notify (object);
}